

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool are_equal(string_view lhs,string_view rhs)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type e;
  size_type i;
  string_view rhs_local;
  string_view lhs_local;
  
  rhs_local._M_str = (char *)lhs._M_len;
  rhs_local._M_len = (size_t)rhs._M_str;
  i = rhs._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&i);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
  if (sVar3 == sVar4) {
    e = 0;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
    for (; e != sVar3; e = e + 1) {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str,e);
      iVar1 = tolower((int)*pvVar5);
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&i,e);
      iVar2 = tolower((int)*pvVar5);
      if (iVar1 != iVar2) {
        return false;
      }
    }
    lhs_local._M_str._7_1_ = true;
  }
  else {
    lhs_local._M_str._7_1_ = false;
  }
  return lhs_local._M_str._7_1_;
}

Assistant:

constexpr bool
are_equal(const std::string_view lhs, const std::string_view rhs) noexcept
{
    if (rhs.size() != lhs.size())
        return false;

    std::string_view::size_type i = 0;
    std::string_view::size_type e = lhs.size();

    for (; i != e; ++i)
        if (std::tolower(lhs[i]) != std::tolower(rhs[i]))
            return false;

    return true;
}